

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::prio_one_thread::strictly_ordered::impl::
dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
::disp_data_source_t::distribute(disp_data_source_t *this,mbox_t *mbox)

{
  dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>_>
  *pdVar1;
  anon_class_24_3_9cd0e2e5 *in_RDX;
  anon_class_16_2_f77679f7 l;
  size_t agents_count;
  work_thread_activity_stats_t result;
  suffix_t local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  duration_t local_68;
  event_queue_t local_60;
  __atomic_base<unsigned_long> _Stack_58;
  __atomic_base<unsigned_long> local_50;
  activity_stats_t local_48;
  
  local_88._0_8_ = 0;
  l.handler = in_RDX;
  l.this = (demand_queue_t *)local_78;
  local_78._0_8_ = this;
  local_78._8_8_ = mbox;
  local_68.__r = (rep)local_88;
  prio::
  for_each_priority<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::handle_stats_for_each_prio<so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>::disp_data_source_t::distribute(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::_lambda(so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::queue_stats_t_const&)_1_>(so_5::disp::prio_one_thread::strictly_ordered::impl::dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t,so_5::disp::prio_one_thread::reuse::work_thread_details::with_activity_tracking_impl_t>>::disp_data_source_t::distribute(so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&)::_lambda(so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::queue_stats_t_const&)_1_)::_lambda(so_5::priority_t)_1_>
            ((prio *)&this->m_dispatcher->m_demand_queue,l);
  local_78._0_8_ = stats::suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&this->m_base_prefix,(suffix_t *)local_78,(unsigned_long *)local_88);
  pdVar1 = this->m_dispatcher;
  local_90 = stats::suffixes::work_thread_activity();
  local_88._8_8_ =
       (pdVar1->m_work_thread).
       super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
       .super_common_data_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>.
       m_thread_id._M_thread;
  stats::activity_tracking_stuff::
  stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock>::take_stats
            ((activity_stats_t *)local_78,
             &(pdVar1->m_work_thread).
              super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
              .m_working_stats);
  local_50._M_i = 0;
  local_60._vptr_event_queue_t = (_func_int **)0x0;
  _Stack_58._M_i = 0;
  stats::activity_tracking_stuff::
  stats_collector_t<so_5::stats::activity_tracking_stuff::internal_lock>::take_stats
            (&local_48,
             &(pdVar1->m_work_thread).
              super_with_activity_tracking_impl_t<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t>
              .m_waiting_stats);
  local_50._M_i = local_48.m_avg_time.__r;
  local_60._vptr_event_queue_t = (_func_int **)local_48.m_count;
  _Stack_58._M_i = local_48.m_total_time.__r;
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&this->m_base_prefix,&local_90,(id *)(local_88 + 8),
             (work_thread_activity_stats_t *)local_78);
  return;
}

Assistant:

virtual void
				distribute( const mbox_t & mbox ) override
					{
						std::size_t agents_count = 0;

						m_dispatcher.m_demand_queue.handle_stats_for_each_prio(
							[&]( const demand_queue_t::queue_stats_t & stat ) {
								distribute_value_for_priority(
									mbox,
									stat.m_priority,
									stat.m_agents_count,
									stat.m_demands_count );

								agents_count += stat.m_agents_count;
							} );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								m_base_prefix,
								stats::suffixes::agent_count(),
								agents_count );

						send_thread_activity_stats(
								mbox,
								m_base_prefix,
								m_dispatcher.m_work_thread );
					}